

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_union_constructor(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  t_type *ptVar5;
  t_const_value *ptVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pptVar7;
  string *psVar8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  t_type *local_150;
  t_type *type_1;
  t_field **local_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  t_type *local_78;
  t_type *type;
  t_field **local_68;
  byte local_5d;
  bool default_value;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public ");
  type_name_abi_cxx11_(&local_50,this,&tstruct->super_t_type,false,false,false,false);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_up((t_generator *)this);
  local_5d = 0;
  local_68 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_30._M_current = local_68;
  do {
    type = (t_type *)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&type);
    if (!bVar1) {
LAB_00316f1e:
      if ((local_5d & 1) == 0) {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"super();");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_down((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"public ");
      type_name_abi_cxx11_(&local_f8,this,&tstruct->super_t_type,false,false,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_f8);
      poVar4 = std::operator<<(poVar4,"(_Fields setField, java.lang.Object value) {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f8);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"  super(setField, value);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"public ");
      type_name_abi_cxx11_(&local_118,this,&tstruct->super_t_type,false,false,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_118);
      poVar4 = std::operator<<(poVar4,"(");
      type_name_abi_cxx11_(&local_138,this,&tstruct->super_t_type,false,false,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_138);
      poVar4 = std::operator<<(poVar4," other) {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"  super(other);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"public ");
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
      poVar4 = std::operator<<(poVar4," deepCopy() {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"  return new ");
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
      poVar4 = std::operator<<(poVar4,"(this);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      local_140 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_30._M_current = local_140;
      while( true ) {
        type_1 = (t_type *)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_30,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&type_1);
        if (!bVar1) break;
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        local_150 = t_field::get_type(*pptVar7);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"public static ");
        type_name_abi_cxx11_(&local_170,this,&tstruct->super_t_type,false,false,false,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_170);
        poVar4 = std::operator<<(poVar4," ");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
        poVar4 = std::operator<<(poVar4,(string *)psVar8);
        poVar4 = std::operator<<(poVar4,"(");
        type_name_abi_cxx11_(&local_190,this,local_150,false,false,false,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_190);
        poVar4 = std::operator<<(poVar4," value) {");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_170);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"  ");
        type_name_abi_cxx11_(&local_1b0,this,&tstruct->super_t_type,false,false,false,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_1b0);
        poVar4 = std::operator<<(poVar4," x = new ");
        type_name_abi_cxx11_(&local_1d0,this,&tstruct->super_t_type,false,false,false,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
        poVar4 = std::operator<<(poVar4,"();");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"  x.set");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
        std::__cxx11::string::string((string *)&local_210,(string *)psVar8);
        get_cap_name(&local_1f0,this,&local_210);
        poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
        poVar4 = std::operator<<(poVar4,"(value);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"  return x;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"}");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        uVar3 = (*(local_150->super_t_doc)._vptr_t_doc[7])();
        if ((uVar3 & 1) != 0) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"public static ");
          type_name_abi_cxx11_(&local_230,this,&tstruct->super_t_type,false,false,false,false);
          poVar4 = std::operator<<(poVar4,(string *)&local_230);
          poVar4 = std::operator<<(poVar4," ");
          pptVar7 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_30);
          psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
          poVar4 = std::operator<<(poVar4,(string *)psVar8);
          poVar4 = std::operator<<(poVar4,"(byte[] value) {");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_230);
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"  ");
          type_name_abi_cxx11_(&local_250,this,&tstruct->super_t_type,false,false,false,false);
          poVar4 = std::operator<<(poVar4,(string *)&local_250);
          poVar4 = std::operator<<(poVar4," x = new ");
          type_name_abi_cxx11_(&local_270,this,&tstruct->super_t_type,false,false,false,false);
          poVar4 = std::operator<<(poVar4,(string *)&local_270);
          poVar4 = std::operator<<(poVar4,"();");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_250);
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"  x.set");
          pptVar7 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_30);
          psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
          std::__cxx11::string::string((string *)&local_2b0,(string *)psVar8);
          get_cap_name(&local_290,this,&local_2b0);
          std::operator<<(poVar4,(string *)&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          if ((this->unsafe_binaries_ & 1U) == 0) {
            poVar4 = t_generator::indent((t_generator *)this,out);
            poVar4 = std::operator<<(poVar4,"(java.nio.ByteBuffer.wrap(value.clone()));");
            std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          }
          else {
            poVar4 = t_generator::indent((t_generator *)this,out);
            poVar4 = std::operator<<(poVar4,"(java.nio.ByteBuffer.wrap(value));");
            std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          }
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"  return x;");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"}");
          poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_30);
      }
      return;
    }
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    ptVar5 = t_field::get_type(*pptVar7);
    local_78 = t_generator::get_true_type(ptVar5);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    ptVar6 = t_field::get_value(*pptVar7);
    if (ptVar6 != (t_const_value *)0x0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"super(_Fields.");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
      std::__cxx11::string::string((string *)&local_b8,(string *)psVar8);
      constant_name(&local_98,this,&local_b8);
      poVar4 = std::operator<<(poVar4,(string *)&local_98);
      poVar4 = std::operator<<(poVar4,", ");
      ptVar5 = local_78;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      ptVar6 = t_field::get_value(*pptVar7);
      render_const_value_abi_cxx11_(&local_d8,this,out,ptVar5,ptVar6);
      poVar4 = std::operator<<(poVar4,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      local_5d = 1;
      goto LAB_00316f1e;
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  } while( true );
}

Assistant:

void t_java_generator::generate_union_constructor(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  indent(out) << "public " << type_name(tstruct) << "() {" << endl;
  indent_up();
  bool default_value = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      indent(out) << "super(_Fields." << constant_name((*m_iter)->get_name()) << ", "
                  << render_const_value(out, type, (*m_iter)->get_value()) << ");" << endl;
      default_value = true;
      break;
    }
  }
  if (default_value == false) {
    indent(out) << "super();" << endl;
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(_Fields setField, java.lang.Object value) {" << endl;
  indent(out) << "  super(setField, value);" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(" << type_name(tstruct) << " other) {"
              << endl;
  indent(out) << "  super(other);" << endl;
  indent(out) << "}" << endl;

  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  // generate "constructors" for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = (*m_iter)->get_type();
    indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name() << "("
                << type_name(type) << " value) {" << endl;
    indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();" << endl;
    indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name()) << "(value);" << endl;
    indent(out) << "  return x;" << endl;
    indent(out) << "}" << endl << endl;

    if (type->is_binary()) {
      indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name()
                  << "(byte[] value) {" << endl;
      indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();"
                  << endl;
      indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name());
      if(unsafe_binaries_) {
        indent(out) << "(java.nio.ByteBuffer.wrap(value));" << endl;
      }else{
        indent(out) << "(java.nio.ByteBuffer.wrap(value.clone()));" << endl;
      }
      indent(out) << "  return x;" << endl;
      indent(out) << "}" << endl << endl;
    }
  }
}